

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalGenerator::FillProjectMap(cmGlobalGenerator *this)

{
  pointer ppcVar1;
  bool bVar2;
  mapped_type *this_00;
  uint uVar3;
  ulong uVar4;
  string name;
  Snapshot snp;
  string snpProjName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  Snapshot local_88;
  Snapshot local_68;
  string local_50;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
  ::clear(&(this->ProjectMap)._M_t);
  uVar3 = 0;
  while( true ) {
    uVar4 = (ulong)uVar3;
    ppcVar1 = (this->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->LocalGenerators).
                      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3) <= uVar4)
    break;
    cmLocalGenerator::GetStateSnapshot(&local_88,ppcVar1[uVar4]);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_local_buf[0] = '\0';
    do {
      cmState::Snapshot::GetProjectName_abi_cxx11_(&local_50,&local_88);
      bVar2 = std::operator!=(&local_a8,&local_50);
      if (bVar2) {
        std::__cxx11::string::_M_assign((string *)&local_a8);
        this_00 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
                  ::operator[](&this->ProjectMap,&local_a8);
        std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::push_back
                  (this_00,(this->LocalGenerators).
                           super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar4);
      }
      cmState::Snapshot::GetBuildsystemDirectoryParent(&local_68,&local_88);
      local_88.Position.Position = local_68.Position.Position;
      local_88.State = local_68.State;
      local_88.Position.Tree = local_68.Position.Tree;
      std::__cxx11::string::~string((string *)&local_50);
      bVar2 = cmState::Snapshot::IsValid(&local_88);
    } while (bVar2);
    std::__cxx11::string::~string((string *)&local_a8);
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void cmGlobalGenerator::FillProjectMap()
{
  this->ProjectMap.clear(); // make sure we start with a clean map
  unsigned int i;
  for(i = 0; i < this->LocalGenerators.size(); ++i)
    {
    // for each local generator add all projects
    cmState::Snapshot snp = this->LocalGenerators[i]->GetStateSnapshot();
    std::string name;
    do
      {
      std::string snpProjName = snp.GetProjectName();
      if (name != snpProjName)
        {
        name = snpProjName;
        this->ProjectMap[name].push_back(this->LocalGenerators[i]);
        }
      snp = snp.GetBuildsystemDirectoryParent();
      }
    while (snp.IsValid());
    }
}